

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void __thiscall NULLCMemory::set(NULLCMemory *this,NULLCArray dst,int dstOffset,char value,int size)

{
  uint uVar1;
  char *error;
  int3 in_register_00000081;
  
  uVar1 = dst.len;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else if (in_register_00000081 < 0) {
    error = "element count is negative";
  }
  else {
    if (uVar1 < (uint)dst.ptr && CONCAT31(in_register_00000081,value) <= (uint)dst.ptr - uVar1) {
      memset(this + uVar1,dstOffset & 0xff,(ulong)CONCAT31(in_register_00000081,value));
      return;
    }
    error = "buffer overflow";
  }
  nullcThrowError(error);
  return;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}